

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O1

void __thiscall
TPZDohrSubstruct<float>::ContributeResidual
          (TPZDohrSubstruct<float> *this,TPZFMatrix<float> *u,TPZFMatrix<float> *r)

{
  int iVar1;
  pair<int,_int> *ppVar2;
  TPZMatrix<float> *pTVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  TPZFMatrix<float> reslocal;
  TPZFMatrix<float> ulocal;
  TPZFMatrix<float> local_150;
  TPZFMatrix<float> local_c0;
  
  iVar1 = this->fNEquations;
  lVar5 = (long)iVar1;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_c0.fElem = (float *)0x0;
  local_c0.fGiven = (float *)0x0;
  local_c0.fSize = 0;
  local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = lVar5;
  TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
  local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
  local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_c0.fWork.fStore = (float *)0x0;
  local_c0.fWork.fNElements = 0;
  local_c0.fWork.fNAlloc = 0;
  if (lVar5 != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar6 = lVar5 * 4;
    }
    local_c0.fElem = (float *)operator_new__(uVar6);
    if (0 < iVar1) {
      memset(local_c0.fElem,0,lVar5 * 4);
    }
  }
  iVar1 = this->fNEquations;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol = 1;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018456d0;
  local_150.fElem = (float *)0x0;
  local_150.fGiven = (float *)0x0;
  local_150.fSize = 0;
  local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow = (long)iVar1;
  TPZVec<int>::TPZVec(&local_150.fPivot.super_TPZVec<int>,0);
  local_150.fPivot.super_TPZVec<int>.fStore = local_150.fPivot.fExtAlloc;
  local_150.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_150.fPivot.super_TPZVec<int>.fNElements = 0;
  local_150.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_150.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b430;
  local_150.fWork.fStore = (float *)0x0;
  local_150.fWork.fNElements = 0;
  local_150.fWork.fNAlloc = 0;
  if (iVar1 != 0) {
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar1) {
      uVar6 = (long)iVar1 << 2;
    }
    local_150.fElem = (float *)operator_new__(uVar6);
  }
  uVar4 = (uint)(this->fGlobalEqs).fNElements;
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      iVar1 = ppVar2[uVar6].first;
      lVar5 = (long)ppVar2[uVar6].second;
      if (((lVar5 < 0) || ((u->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar5)) ||
         ((u->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar1 < 0) || (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= iVar1)) ||
         (local_c0.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_c0.fElem[iVar1] = u->fElem[lVar5];
      uVar6 = uVar6 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar6);
  }
  pTVar3 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar3->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x28])
            (pTVar3,&local_c0,&this->fLocalLoad,&local_150);
  if (0 < (int)uVar4) {
    uVar6 = 0;
    do {
      ppVar2 = (this->fGlobalEqs).fStore;
      lVar7 = (long)ppVar2[uVar6].first;
      iVar1 = ppVar2[uVar6].second;
      lVar5 = (long)iVar1;
      if (((lVar7 < 0) || (local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fRow <= lVar7)) ||
         (local_150.super_TPZMatrix<float>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (((iVar1 < 0) || ((r->super_TPZMatrix<float>).super_TPZBaseMatrix.fRow <= lVar5)) ||
         ((r->super_TPZMatrix<float>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<float>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      r->fElem[lVar5] = local_150.fElem[lVar7] + r->fElem[lVar5];
      uVar6 = uVar6 + 1;
    } while ((uVar4 & 0x7fffffff) != uVar6);
  }
  TPZFMatrix<float>::~TPZFMatrix(&local_150);
  TPZFMatrix<float>::~TPZFMatrix(&local_c0);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::ContributeResidual(TPZFMatrix<TVar> &u, TPZFMatrix<TVar> &r){
	TPZFMatrix<TVar> ulocal(fNEquations,1,0.);
	TPZFMatrix<TVar> reslocal(fNEquations,1);
	int i;
	int neqs = fGlobalEqs.NElements();
	for (i=0;i<neqs;i++) 
	{
		std::pair<int,int> ind = fGlobalEqs[i];
		ulocal(ind.first,0) = u(ind.second,0);
	}
	fStiffness->Residual(ulocal, fLocalLoad, reslocal);
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		r(ind.second,0) += reslocal(ind.first,0);
	}
}